

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::BufferDescriptorCase::genResourceDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage,int numUsedBindings
          )

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostringstream buf;
  ostringstream aoStack_198 [376];
  
  uVar2 = *(int *)((long)this + 0x84) - 4;
  if (uVar2 < 5) {
    pcVar4 = &DAT_00960a28 + *(int *)(&DAT_00960a28 + (ulong)uVar2 * 4);
  }
  else {
    pcVar4 = "buffer";
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  iVar1 = *(int *)((long)this + 0x88);
  if (iVar1 == 3) {
    poVar3 = std::operator<<((ostream *)aoStack_198,"layout(set = 0, binding = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numUsedBindings);
    poVar3 = std::operator<<(poVar3,", std140) ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," BufferName\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorA;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorB;\n");
    pcVar4 = "} b_instances[2];\n";
  }
  else if (iVar1 == 1) {
    poVar3 = std::operator<<((ostream *)aoStack_198,"layout(set = 0, binding = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numUsedBindings);
    poVar3 = std::operator<<(poVar3,", std140) ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," BufferNameA\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorA;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorB;\n");
    poVar3 = std::operator<<(poVar3,"} b_instanceA;\n");
    poVar3 = std::operator<<(poVar3,"layout(set = 0, binding = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numUsedBindings + 1);
    poVar3 = std::operator<<(poVar3,", std140) ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," BufferNameB\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorA;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorB;\n");
    pcVar4 = "} b_instanceB;\n";
  }
  else {
    if (iVar1 != 0) goto LAB_00549c42;
    poVar3 = std::operator<<((ostream *)aoStack_198,"layout(set = 0, binding = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numUsedBindings);
    poVar3 = std::operator<<(poVar3,", std140) ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," BufferName\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorA;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 colorB;\n");
    pcVar4 = "} b_instance;\n";
  }
  std::operator<<(poVar3,pcVar4);
LAB_00549c42:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string BufferDescriptorCase::genResourceDeclarations (vk::VkShaderStageFlagBits stage, int numUsedBindings) const
{
	DE_UNREF(stage);

	const bool			isUniform		= isUniformDescriptorType(m_descriptorType);
	const char* const	storageType		= (isUniform) ? ("uniform") : ("buffer");
	std::ostringstream	buf;

	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferName\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instance;\n";
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferNameA\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instanceA;\n"
				<< "layout(set = 0, binding = " << (numUsedBindings+1) << ", std140) " << storageType << " BufferNameB\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instanceB;\n";
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferName\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instances[2];\n";
			break;

		default:
			DE_FATAL("Impossible");
	}

	return buf.str();
}